

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGXMLScanner.cpp
# Opt level: O3

void __thiscall xercesc_4_0::IGXMLScanner::scanDocTypeDecl(IGXMLScanner *this)

{
  ReaderMgr *this_00;
  XMLBufferMgr *this_01;
  short *psVar1;
  DocTypeHandler *pDVar2;
  MemoryManager *pMVar3;
  NameIdPool<xercesc_4_0::DTDElementDecl> *pNVar4;
  Grammar *pGVar5;
  GrammarResolver *this_02;
  XMLValidator *pXVar6;
  XMLStringPool *pXVar7;
  bool bVar8;
  XMLCh XVar9;
  XMLCh XVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  XMLBuffer *toFill;
  undefined4 extraout_var;
  DTDElementDecl *this_03;
  ulong uVar14;
  XMLSize_t XVar15;
  XMLBuffer *pubIdToFill;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  InputSource *pIVar16;
  undefined4 extraout_var_03;
  DTDGrammar *pDVar17;
  XMLReader *pXVar18;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  XMLEntityDecl *this_04;
  XMLCh *pXVar19;
  RuntimeException *this_05;
  undefined4 extraout_var_07;
  MemoryManager **ppMVar20;
  byte bVar21;
  byte bVar22;
  DTDElementDecl *pDVar23;
  RefHashTableBucketElem<xercesc_4_0::DTDElementDecl> *pRVar24;
  XMLCh *pXVar25;
  size_t sVar26;
  InputSource *pIVar27;
  XMLCh *local_120;
  char16_t *local_118;
  bool skippedSomething;
  DTDElementDecl *local_108;
  InputSource *srcUsed;
  XMLBuffer *local_f8;
  XMLBuffer *local_f0;
  ArrayJanitor<char16_t> janPubId;
  ArrayJanitor<char16_t> janSysId;
  XMLBufBid bbRootName;
  XMLCh gDTDStr [4];
  int colonPosition;
  DTDScanner dtdScanner;
  undefined4 extraout_var_02;
  undefined4 extraout_var_06;
  
  switchGrammar(this,L"[dtd]");
  pDVar2 = (this->super_XMLScanner).fDocTypeHandler;
  if (pDVar2 != (DocTypeHandler *)0x0) {
    (*pDVar2->_vptr_DocTypeHandler[0xc])();
  }
  this_00 = &(this->super_XMLScanner).fReaderMgr;
  ReaderMgr::skipPastSpaces(this_00,&skippedSomething,false);
  if (skippedSomething == false) {
    XMLScanner::emitError(&this->super_XMLScanner,ExpectedWhitespace);
    do {
      XVar9 = ReaderMgr::getNextChar(this_00);
      if (XVar9 == L'\0') {
        return;
      }
    } while (XVar9 != L'>');
    return;
  }
  this_01 = &(this->super_XMLScanner).fBufMgr;
  toFill = XMLBufferMgr::bidOnBuffer(this_01);
  bVar8 = (this->super_XMLScanner).fDoNamespaces;
  toFill->fIndex = 0;
  pXVar18 = (this->super_XMLScanner).fReaderMgr.fCurReader;
  if (bVar8 == true) {
    bVar8 = XMLReader::getQName(pXVar18,toFill,&colonPosition);
  }
  else {
    bVar8 = XMLReader::getName(pXVar18,toFill,false);
  }
  if (bVar8 == false) {
    if (toFill->fIndex == 0) {
      XMLScanner::emitError(&this->super_XMLScanner,NoRootElemInDOCTYPE);
    }
    else {
      pXVar19 = toFill->fBuffer;
      pXVar19[toFill->fIndex] = L'\0';
      XMLScanner::emitError
                (&this->super_XMLScanner,InvalidRootElemInDOCTYPE,pXVar19,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
    }
    do {
      XVar9 = ReaderMgr::getNextChar(this_00);
      if (XVar9 == L'\0') break;
    } while (XVar9 != L'>');
    goto LAB_002a1bc2;
  }
  pXVar19 = toFill->fBuffer;
  pXVar19[toFill->fIndex] = L'\0';
  pMVar3 = (this->super_XMLScanner).fMemoryManager;
  (*pMVar3->_vptr_MemoryManager[4])(pMVar3,(this->super_XMLScanner).fRootElemName);
  pMVar3 = (this->super_XMLScanner).fMemoryManager;
  sVar26 = 0;
  do {
    psVar1 = (short *)((long)pXVar19 + sVar26);
    sVar26 = sVar26 + 2;
  } while (*psVar1 != 0);
  iVar11 = (*pMVar3->_vptr_MemoryManager[3])(pMVar3,sVar26);
  memcpy((XMLCh *)CONCAT44(extraout_var,iVar11),pXVar19,sVar26);
  (this->super_XMLScanner).fRootElemName = (XMLCh *)CONCAT44(extraout_var,iVar11);
  ppMVar20 = &(this->super_XMLScanner).fGrammarPoolMemoryManager;
  if ((this->super_XMLScanner).fUseCachedGrammar != false) {
    ppMVar20 = &(this->super_XMLScanner).fMemoryManager;
  }
  pMVar3 = *ppMVar20;
  this_03 = (DTDElementDecl *)XMemory::operator_new(0x58,pMVar3);
  pXVar19 = toFill->fBuffer;
  pXVar19[toFill->fIndex] = L'\0';
  DTDElementDecl::DTDElementDecl
            (this_03,pXVar19,(this->super_XMLScanner).fEmptyNamespaceId,Any,pMVar3);
  (this_03->super_XMLElementDecl).fCreateReason = AsRootElem;
  (this_03->super_XMLElementDecl).fExternalElement = true;
  if ((this->super_XMLScanner).fUseCachedGrammar == false) {
    pGVar5 = (this->super_XMLScanner).fGrammar;
    (*(pGVar5->super_XSerializable)._vptr_XSerializable[0x11])(pGVar5,this_03,0);
    pDVar23 = (DTDElementDecl *)0x0;
  }
  else {
    pNVar4 = this->fDTDElemNonDeclPool;
    pXVar19 = toFill->fBuffer;
    pXVar19[toFill->fIndex] = L'\0';
    if (pNVar4->fIdCounter != 0) {
      uVar14 = (ulong)(ushort)*pXVar19;
      if (uVar14 == 0) {
        uVar14 = 0;
      }
      else {
        XVar9 = pXVar19[1];
        if (XVar9 != L'\0') {
          pXVar25 = pXVar19 + 2;
          do {
            uVar14 = (ulong)(ushort)XVar9 + (uVar14 >> 0x18) + uVar14 * 0x26;
            XVar9 = *pXVar25;
            pXVar25 = pXVar25 + 1;
          } while (XVar9 != L'\0');
        }
        uVar14 = uVar14 % (pNVar4->fBucketList).fHashModulus;
      }
      pRVar24 = (pNVar4->fBucketList).fBucketList[uVar14];
      if (pRVar24 != (RefHashTableBucketElem<xercesc_4_0::DTDElementDecl> *)0x0) {
        do {
          bVar8 = StringHasher::equals
                            ((StringHasher *)&(pNVar4->fBucketList).field_0x30,pXVar19,pRVar24->fKey
                            );
          if (bVar8) {
            if (pRVar24->fData != (DTDElementDecl *)0x0) {
              XVar15 = (pRVar24->fData->super_XMLElementDecl).fId;
              pDVar23 = this_03;
              goto LAB_002a1528;
            }
            break;
          }
          pRVar24 = pRVar24->fNext;
        } while (pRVar24 != (RefHashTableBucketElem<xercesc_4_0::DTDElementDecl> *)0x0);
      }
    }
    XVar15 = NameIdPool<xercesc_4_0::DTDElementDecl>::put(this->fDTDElemNonDeclPool,this_03);
    pDVar23 = (DTDElementDecl *)0x0;
LAB_002a1528:
    (this_03->super_XMLElementDecl).fId = XVar15;
  }
  ReaderMgr::skipPastSpaces(this_00);
  bVar8 = ReaderMgr::skippedChar(this_00,L'>');
  if (bVar8) {
    pDVar2 = (this->super_XMLScanner).fDocTypeHandler;
    if (pDVar2 != (DocTypeHandler *)0x0) {
      (*pDVar2->_vptr_DocTypeHandler[4])(pDVar2,this_03,0,0,0,0);
    }
  }
  else {
    if (((this->super_XMLScanner).fValScheme == Val_Auto) &&
       ((this->super_XMLScanner).fValidate == false)) {
      (this->super_XMLScanner).fValidate = true;
    }
    local_108 = pDVar23;
    DTDScanner::DTDScanner
              (&dtdScanner,(DTDGrammar *)(this->super_XMLScanner).fGrammar,
               (this->super_XMLScanner).fDocTypeHandler,
               (this->super_XMLScanner).fGrammarPoolMemoryManager,
               (this->super_XMLScanner).fMemoryManager);
    DTDScanner::setScannerInfo(&dtdScanner,&this->super_XMLScanner,this_00,this_01);
    XVar9 = ReaderMgr::peekNextChar(this_00);
    if (XVar9 == L'[') {
      bVar21 = 1;
      bVar22 = 1;
      local_120 = (char16_t *)0x0;
      local_118 = (char16_t *)0x0;
LAB_002a1733:
      ArrayJanitor<char16_t>::ArrayJanitor
                (&janSysId,local_120,(this->super_XMLScanner).fMemoryManager);
      ArrayJanitor<char16_t>::ArrayJanitor
                (&janPubId,local_118,(this->super_XMLScanner).fMemoryManager);
      if (XVar9 != L'[') {
        ReaderMgr::skipPastSpaces(this_00);
        XVar10 = ReaderMgr::peekNextChar(this_00);
        bVar22 = 1;
        if (XVar10 != L'[') {
          bVar22 = bVar21;
        }
      }
      pDVar2 = (this->super_XMLScanner).fDocTypeHandler;
      if (pDVar2 != (DocTypeHandler *)0x0) {
        (*pDVar2->_vptr_DocTypeHandler[4])
                  (pDVar2,this_03,local_118,local_120,(ulong)bVar22,(ulong)(XVar9 != L'['));
      }
      bVar21 = 1;
      if (bVar22 == 0) {
LAB_002a1820:
        bVar8 = ReaderMgr::skippedChar(this_00,L'>');
        if (!bVar8) {
          bVar8 = ReaderMgr::skippedChar(this_00,L']');
          if ((bVar8) && (bVar8 = ReaderMgr::skippedChar(this_00,L'>'), bVar8)) {
            XMLScanner::emitError(&this->super_XMLScanner,ExtraCloseSquare);
          }
          else {
            XMLScanner::emitError(&this->super_XMLScanner,UnterminatedDOCTYPE);
            do {
              XVar10 = ReaderMgr::getNextChar(this_00);
              if (XVar10 == L'>') break;
            } while (XVar10 != L'\0');
          }
        }
        if (XVar9 != L'[') {
          srcUsed = (InputSource *)0x0;
          if ((bVar21 & (this->super_XMLScanner).fUseCachedGrammar) == 1) {
            iVar11 = (*(this->super_XMLScanner).super_XMLBufferFullHandler.
                       _vptr_XMLBufferFullHandler[0x11])(this,local_120,local_118);
            pIVar16 = (InputSource *)CONCAT44(extraout_var_02,iVar11);
            srcUsed = pIVar16;
            if (pIVar16 == (InputSource *)0x0) goto LAB_002a1960;
            this_02 = (this->super_XMLScanner).fGrammarResolver;
            iVar11 = (*pIVar16->_vptr_InputSource[5])(pIVar16);
            pDVar17 = (DTDGrammar *)
                      GrammarResolver::getGrammar(this_02,(XMLCh *)CONCAT44(extraout_var_03,iVar11))
            ;
            pIVar27 = pIVar16;
            if ((pDVar17 == (DTDGrammar *)0x0) ||
               (iVar11 = (*(pDVar17->super_Grammar).super_XSerializable._vptr_XSerializable[5])
                                   (pDVar17), iVar11 != 0)) goto LAB_002a1963;
            this->fDTDGrammar = pDVar17;
            (this->super_XMLScanner).fGrammar = (Grammar *)pDVar17;
            pXVar6 = (this->super_XMLScanner).fValidator;
            (*pXVar6->_vptr_XMLValidator[0xb])(pXVar6,pDVar17);
            pDVar2 = (this->super_XMLScanner).fDocTypeHandler;
            if (pDVar2 != (DocTypeHandler *)0x0) {
              (*pDVar2->_vptr_DocTypeHandler[0x10])();
              (*((this->super_XMLScanner).fDocTypeHandler)->_vptr_DocTypeHandler[10])();
            }
          }
          else {
LAB_002a1960:
            pIVar27 = (InputSource *)0x0;
LAB_002a1963:
            pIVar16 = pIVar27;
            if (((this->super_XMLScanner).fLoadExternalDTD != false) ||
               ((this->super_XMLScanner).fValidate == true)) {
              bVar8 = (this->super_XMLScanner).fCalculateSrcOfs;
              XVar15 = (this->super_XMLScanner).fLowWaterMark;
              if (srcUsed == (InputSource *)0x0) {
                pXVar18 = ReaderMgr::createReader
                                    (this_00,local_120,local_118,false,RefFrom_NonLiteral,
                                     Type_General,Source_External,&srcUsed,bVar8,XVar15,
                                     (this->super_XMLScanner).fDisableDefaultEntityResolution);
                pIVar16 = srcUsed;
                if (pIVar27 != (InputSource *)0x0) {
                  (*pIVar27->_vptr_InputSource[1])(pIVar27);
                }
              }
              else {
                pXVar18 = ReaderMgr::createReader
                                    (this_00,srcUsed,false,RefFrom_NonLiteral,Type_General,
                                     Source_External,bVar8,XVar15);
              }
              if (pXVar18 == (XMLReader *)0x0) {
                this_05 = (RuntimeException *)__cxa_allocate_exception(0x30);
                if (srcUsed != (InputSource *)0x0) {
                  iVar11 = (*srcUsed->_vptr_InputSource[5])();
                  local_120 = (XMLCh *)CONCAT44(extraout_var_07,iVar11);
                }
                RuntimeException::RuntimeException
                          (this_05,
                           "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/IGXMLScanner.cpp"
                           ,0x5ed,Gen_CouldNotOpenDTD,local_120,(XMLCh *)0x0,(XMLCh *)0x0,
                           (XMLCh *)0x0,(this->super_XMLScanner).fMemoryManager);
                __cxa_throw(this_05,&RuntimeException::typeinfo,XMLException::~XMLException);
              }
              if ((this->super_XMLScanner).fToCacheGrammar == true) {
                pXVar7 = ((this->super_XMLScanner).fGrammarResolver)->fStringPool;
                iVar11 = (*srcUsed->_vptr_InputSource[5])();
                uVar12 = (*(pXVar7->super_XSerializable)._vptr_XSerializable[5])
                                   (pXVar7,CONCAT44(extraout_var_04,iVar11));
                pXVar7 = ((this->super_XMLScanner).fGrammarResolver)->fStringPool;
                iVar11 = (*(pXVar7->super_XSerializable)._vptr_XSerializable[10])
                                   (pXVar7,(ulong)uVar12);
                GrammarResolver::orphanGrammar((this->super_XMLScanner).fGrammarResolver,L"[dtd]");
                iVar13 = (*(((this->super_XMLScanner).fGrammar)->super_XSerializable).
                           _vptr_XSerializable[0x16])();
                (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar13) + 0x50))
                          ((long *)CONCAT44(extraout_var_05,iVar13),iVar11);
                GrammarResolver::putGrammar
                          ((this->super_XMLScanner).fGrammarResolver,
                           (this->super_XMLScanner).fGrammar);
              }
              builtin_memcpy(gDTDStr,L"DTD",8);
              this_04 = (XMLEntityDecl *)
                        XMemory::operator_new(0x60,(this->super_XMLScanner).fMemoryManager);
              XMLEntityDecl::XMLEntityDecl(this_04,gDTDStr,(this->super_XMLScanner).fMemoryManager);
              (this_04->super_XSerializable)._vptr_XSerializable =
                   (_func_int **)&PTR__XMLEntityDecl_00408758;
              *(undefined2 *)&this_04[1].super_XSerializable._vptr_XSerializable = 0;
              *(undefined1 *)((long)&this_04[1].super_XSerializable._vptr_XSerializable + 2) = 0;
              if (this_04->fSystemId != (XMLCh *)0x0) {
                (*this_04->fMemoryManager->_vptr_MemoryManager[4])();
              }
              if (local_120 == (char16_t *)0x0) {
                pXVar19 = (XMLCh *)0x0;
              }
              else {
                sVar26 = 0;
                do {
                  psVar1 = (short *)((long)local_120 + sVar26);
                  sVar26 = sVar26 + 2;
                } while (*psVar1 != 0);
                iVar11 = (*this_04->fMemoryManager->_vptr_MemoryManager[3])
                                   (this_04->fMemoryManager,sVar26);
                pXVar19 = (XMLCh *)CONCAT44(extraout_var_06,iVar11);
                memcpy(pXVar19,local_120,sVar26);
              }
              this_04->fSystemId = pXVar19;
              this_04->fIsExternal = true;
              pXVar18->fThrowAtEnd = true;
              ReaderMgr::pushReaderAdoptEntity(this_00,pXVar18,this_04,true);
              DTDScanner::scanExtSubsetDecl(&dtdScanner,false,true);
            }
            if (pIVar16 == (InputSource *)0x0) goto LAB_002a1b8d;
          }
          (*pIVar16->_vptr_InputSource[1])(pIVar16);
        }
      }
      else {
        ReaderMgr::getNextChar(this_00);
        XMLScanner::checkInternalDTD(&this->super_XMLScanner,XVar9 != L'[',local_120,local_118);
        bVar8 = DTDScanner::scanInternalSubset(&dtdScanner);
        if (bVar8) {
          XVar15 = ReaderMgr::getReaderDepth(this_00);
          if (1 < XVar15) {
            XMLScanner::emitError(&this->super_XMLScanner,PEPropogated);
            ReaderMgr::cleanStackBackTo(this_00,1);
          }
          ReaderMgr::skipPastSpaces(this_00);
          bVar21 = 0;
          goto LAB_002a1820;
        }
        do {
          XVar9 = ReaderMgr::getNextChar(this_00);
          if (XVar9 == L'\0') break;
        } while (XVar9 != L'>');
      }
LAB_002a1b8d:
      ArrayJanitor<char16_t>::~ArrayJanitor(&janPubId);
      ArrayJanitor<char16_t>::~ArrayJanitor(&janSysId);
      pDVar23 = local_108;
    }
    else {
      (this->super_XMLScanner).fHasNoDTD = false;
      pubIdToFill = XMLBufferMgr::bidOnBuffer(this_01);
      janSysId.fData = (char16_t *)pubIdToFill;
      janSysId.fMemoryManager = (MemoryManager *)this_01;
      local_f0 = XMLBufferMgr::bidOnBuffer(this_01);
      pDVar23 = local_108;
      local_f8 = pubIdToFill;
      janPubId.fData = (char16_t *)local_f0;
      janPubId.fMemoryManager = (MemoryManager *)this_01;
      bVar8 = DTDScanner::scanId(&dtdScanner,pubIdToFill,local_f0,IDType_External);
      if (bVar8) {
        pXVar19 = local_f8->fBuffer;
        pXVar19[local_f8->fIndex] = L'\0';
        pMVar3 = (this->super_XMLScanner).fMemoryManager;
        sVar26 = 0;
        do {
          psVar1 = (short *)((long)pXVar19 + sVar26);
          sVar26 = sVar26 + 2;
        } while (*psVar1 != 0);
        iVar11 = (*pMVar3->_vptr_MemoryManager[3])(pMVar3,sVar26);
        local_118 = (char16_t *)CONCAT44(extraout_var_00,iVar11);
        memcpy(local_118,pXVar19,sVar26);
        pXVar19 = local_f0->fBuffer;
        pXVar19[local_f0->fIndex] = L'\0';
        pMVar3 = (this->super_XMLScanner).fMemoryManager;
        sVar26 = 0;
        do {
          psVar1 = (short *)((long)pXVar19 + sVar26);
          sVar26 = sVar26 + 2;
        } while (*psVar1 != 0);
        iVar11 = (*pMVar3->_vptr_MemoryManager[3])(pMVar3,sVar26);
        local_120 = (XMLCh *)CONCAT44(extraout_var_01,iVar11);
        memcpy(local_120,pXVar19,sVar26);
      }
      else {
        do {
          XVar10 = ReaderMgr::getNextChar(this_00);
          if (XVar10 == L'\0') break;
        } while (XVar10 != L'>');
        local_120 = (char16_t *)0x0;
        local_118 = (char16_t *)0x0;
      }
      XMLBufferMgr::releaseBuffer(this_01,local_f0);
      XMLBufferMgr::releaseBuffer(this_01,local_f8);
      if (bVar8) {
        bVar21 = 0;
        bVar22 = 0;
        goto LAB_002a1733;
      }
    }
    DTDScanner::~DTDScanner(&dtdScanner);
  }
  if (pDVar23 != (DTDElementDecl *)0x0) {
    (*(pDVar23->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[1])(pDVar23);
  }
LAB_002a1bc2:
  XMLBufferMgr::releaseBuffer(this_01,toFill);
  return;
}

Assistant:

void IGXMLScanner::scanDocTypeDecl()
{
    //  We have a doc type. So, switch the Grammar.
    switchGrammar(XMLUni::fgDTDEntityString);

    if (fDocTypeHandler)
        fDocTypeHandler->resetDocType();

    // There must be some space after DOCTYPE
    bool skippedSomething;
    fReaderMgr.skipPastSpaces(skippedSomething);
    if (!skippedSomething)
    {
        emitError(XMLErrs::ExpectedWhitespace);

        // Just skip the Doctype declaration and return
        fReaderMgr.skipPastChar(chCloseAngle);
        return;
    }

    // Get a buffer for the root element
    XMLBufBid bbRootName(&fBufMgr);

    //  Get a name from the input, which should be the name of the root
    //  element of the upcoming content.
    int  colonPosition;
    bool validName = fDoNamespaces ? fReaderMgr.getQName(bbRootName.getBuffer(), &colonPosition) :
                                     fReaderMgr.getName(bbRootName.getBuffer());
    if (!validName)
    {
        if (bbRootName.isEmpty())
            emitError(XMLErrs::NoRootElemInDOCTYPE);
        else
            emitError(XMLErrs::InvalidRootElemInDOCTYPE, bbRootName.getRawBuffer());
        fReaderMgr.skipPastChar(chCloseAngle);
        return;
    }

    //  Store the root element name for later check
    setRootElemName(bbRootName.getRawBuffer());

    //  This element obviously is not going to exist in the element decl
    //  pool yet, but we need to call docTypeDecl. So force it into
    //  the element decl pool, marked as being there because it was in
    //  the DOCTYPE. Later, when its declared, the status will be updated.
    //
    //  Only do this if we are not reusing the validator! If we are reusing,
    //  then look it up instead. It has to exist!
    MemoryManager* const  rootDeclMgr =
        fUseCachedGrammar ? fMemoryManager : fGrammarPoolMemoryManager;

    DTDElementDecl* rootDecl = new (rootDeclMgr) DTDElementDecl
    (
        bbRootName.getRawBuffer()
        , fEmptyNamespaceId
        , DTDElementDecl::Any
        , rootDeclMgr
    );

    Janitor<DTDElementDecl> rootDeclJanitor(rootDecl);
    rootDecl->setCreateReason(DTDElementDecl::AsRootElem);
    rootDecl->setExternalElemDeclaration(true);
    if(!fUseCachedGrammar)
    {
        fGrammar->putElemDecl(rootDecl);
        rootDeclJanitor.release();
    } else
    {
        // attach this to the undeclared element pool so that it gets deleted
        XMLElementDecl* elemDecl = fDTDElemNonDeclPool->getByKey(bbRootName.getRawBuffer());
        if (elemDecl)
        {
            rootDecl->setId(elemDecl->getId());
        }
        else
        {
            rootDecl->setId(fDTDElemNonDeclPool->put((DTDElementDecl*)rootDecl));
            rootDeclJanitor.release();
        }
    }

    // Skip any spaces after the name
    fReaderMgr.skipPastSpaces();

    //  And now if we are looking at a >, then we are done. It is not
    //  required to have an internal or external subset, though why you
    //  would not escapes me.
    if (fReaderMgr.skippedChar(chCloseAngle)) {

        //  If we have a doc type handler and advanced callbacks are enabled,
        //  call the doctype event.
        if (fDocTypeHandler)
            fDocTypeHandler->doctypeDecl(*rootDecl, 0, 0, false);
        return;
    }

    // either internal/external subset
    if (fValScheme == Val_Auto && !fValidate)
        fValidate = true;

    bool    hasIntSubset = false;
    bool    hasExtSubset = false;
    XMLCh*  sysId = 0;
    XMLCh*  pubId = 0;

    DTDScanner dtdScanner
    (
        (DTDGrammar*) fGrammar
        , fDocTypeHandler
        , fGrammarPoolMemoryManager
        , fMemoryManager
    );
    dtdScanner.setScannerInfo(this, &fReaderMgr, &fBufMgr);

    //  If the next character is '[' then we have no external subset cause
    //  there is no system id, just the opening character of the internal
    //  subset. Else, has to be an id.
    //
    // Just look at the next char, don't eat it.
    if (fReaderMgr.peekNextChar() == chOpenSquare)
    {
        hasIntSubset = true;
    }
    else
    {
        // Indicate we have an external subset
        hasExtSubset = true;
        fHasNoDTD = false;

        // Get buffers for the ids
        XMLBufBid bbPubId(&fBufMgr);
        XMLBufBid bbSysId(&fBufMgr);

        // Get the external subset id
        if (!dtdScanner.scanId(bbPubId.getBuffer(), bbSysId.getBuffer(), DTDScanner::IDType_External))
        {
            fReaderMgr.skipPastChar(chCloseAngle);
            return;
        }

        // Get copies of the ids we got
        pubId = XMLString::replicate(bbPubId.getRawBuffer(), fMemoryManager);
        sysId = XMLString::replicate(bbSysId.getRawBuffer(), fMemoryManager);
    }

    // Insure that the ids get cleaned up, if they got allocated
    ArrayJanitor<XMLCh> janSysId(sysId, fMemoryManager);
    ArrayJanitor<XMLCh> janPubId(pubId, fMemoryManager);

    if (hasExtSubset)
    {
        // Skip spaces and check again for the opening of an internal subset
        fReaderMgr.skipPastSpaces();

        // Just look at the next char, don't eat it.
        if (fReaderMgr.peekNextChar() == chOpenSquare) {
            hasIntSubset = true;
        }
    }

    //  If we have a doc type handler and advanced callbacks are enabled,
    //  call the doctype event.
    if (fDocTypeHandler)
        fDocTypeHandler->doctypeDecl(*rootDecl, pubId, sysId, hasIntSubset, hasExtSubset);

    //  Ok, if we had an internal subset, we are just past the [ character
    //  and need to parse that first.
    if (hasIntSubset)
    {
        // Eat the opening square bracket
        fReaderMgr.getNextChar();

        checkInternalDTD(hasExtSubset, sysId, pubId);

        //  And try to scan the internal subset. If we fail, try to recover
        //  by skipping forward tot he close angle and returning.
        if (!dtdScanner.scanInternalSubset())
        {
            fReaderMgr.skipPastChar(chCloseAngle);
            return;
        }

        //  Do a sanity check that some expanded PE did not propogate out of
        //  the doctype. This could happen if it was terminated early by bad
        //  syntax.
        if (fReaderMgr.getReaderDepth() > 1)
        {
            emitError(XMLErrs::PEPropogated);

            // Ask the reader manager to pop back down to the main level
            fReaderMgr.cleanStackBackTo(1);
        }

        fReaderMgr.skipPastSpaces();
    }

    // And that should leave us at the closing > of the DOCTYPE line
    if (!fReaderMgr.skippedChar(chCloseAngle))
    {
        //  Do a special check for the common scenario of an extra ] char at
        //  the end. This is easy to recover from.
        if (fReaderMgr.skippedChar(chCloseSquare)
        &&  fReaderMgr.skippedChar(chCloseAngle))
        {
            emitError(XMLErrs::ExtraCloseSquare);
        }
         else
        {
            emitError(XMLErrs::UnterminatedDOCTYPE);
            fReaderMgr.skipPastChar(chCloseAngle);
        }
    }

    //  If we had an external subset, then we need to deal with that one
    //  next. If we are reusing the validator, then don't scan it.
    if (hasExtSubset) {

        InputSource* srcUsed=0;
        Janitor<InputSource> janSrc(srcUsed);
        // If we had an internal subset and we're using the cached grammar, it
        // means that the ignoreCachedDTD is set, so we ignore the cached
        // grammar
        if (fUseCachedGrammar && !hasIntSubset)
        {
            srcUsed = resolveSystemId(sysId, pubId);
            if (srcUsed) {
                janSrc.reset(srcUsed);
                Grammar* grammar = fGrammarResolver->getGrammar(srcUsed->getSystemId());

                if (grammar && grammar->getGrammarType() == Grammar::DTDGrammarType) {

                    fDTDGrammar = (DTDGrammar*) grammar;
                    fGrammar = fDTDGrammar;
                    fValidator->setGrammar(fGrammar);
                    // If we don't report at least the external subset boundaries,
                    // an advanced document handler cannot know when the DTD end,
                    // since we've already sent a doctype decl that indicates there's
                    // there's an external subset.
                    if (fDocTypeHandler)
                    {
                        fDocTypeHandler->startExtSubset();
                        fDocTypeHandler->endExtSubset();
                    }

                    return;
                }
            }
        }

        if (fLoadExternalDTD || fValidate)
        {
            // And now create a reader to read this entity
            XMLReader* reader;
            if (srcUsed) {
                reader = fReaderMgr.createReader
                        (
                            *srcUsed
                            , false
                            , XMLReader::RefFrom_NonLiteral
                            , XMLReader::Type_General
                            , XMLReader::Source_External
                            , fCalculateSrcOfs
                            , fLowWaterMark
                        );
            }
            else {
                reader = fReaderMgr.createReader
                        (
                            sysId
                            , pubId
                            , false
                            , XMLReader::RefFrom_NonLiteral
                            , XMLReader::Type_General
                            , XMLReader::Source_External
                            , srcUsed
                            , fCalculateSrcOfs
                            , fLowWaterMark
                            , fDisableDefaultEntityResolution
                        );
                janSrc.reset(srcUsed);
            }
            //  If it failed then throw an exception
            if (!reader)
                ThrowXMLwithMemMgr1(RuntimeException, XMLExcepts::Gen_CouldNotOpenDTD, srcUsed ? srcUsed->getSystemId() : sysId, fMemoryManager);

            if (fToCacheGrammar) {

                unsigned int stringId = fGrammarResolver->getStringPool()->addOrFind(srcUsed->getSystemId());
                const XMLCh* sysIdStr = fGrammarResolver->getStringPool()->getValueForId(stringId);

                fGrammarResolver->orphanGrammar(XMLUni::fgDTDEntityString);
                ((XMLDTDDescription*) (fGrammar->getGrammarDescription()))->setSystemId(sysIdStr);
                fGrammarResolver->putGrammar(fGrammar);
            }

            //  In order to make the processing work consistently, we have to
            //  make this look like an external entity. So create an entity
            //  decl and fill it in and push it with the reader, as happens
            //  with an external entity. Put a janitor on it to insure it gets
            //  cleaned up. The reader manager does not adopt them.
            const XMLCh gDTDStr[] = { chLatin_D, chLatin_T, chLatin_D , chNull };
            DTDEntityDecl* declDTD = new (fMemoryManager) DTDEntityDecl(gDTDStr, false, fMemoryManager);
            declDTD->setSystemId(sysId);
            declDTD->setIsExternal(true);

            // Mark this one as a throw at end
            reader->setThrowAtEnd(true);

            // And push it onto the stack, with its pseudo name
            fReaderMgr.pushReaderAdoptEntity(reader, declDTD);

            // Tell it its not in an include section
            dtdScanner.scanExtSubsetDecl(false, true);
        }
    }
}